

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int parseArgs(int argc,char **argv,char **in_file_path_ptr,char **out_file_path_ptr,
             uint *target_driver_ptr,size_t *file_offset_ptr)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  size_t sVar4;
  char *__s;
  ulong uVar5;
  
  if (1 < argc) {
    uVar5 = 1;
    do {
      pcVar1 = argv[uVar5];
      if (*pcVar1 != '-') {
        pcVar1 = argv[uVar5 & 0xffffffff];
        *in_file_path_ptr = pcVar1;
        if ((int)(uVar5 + 1) < argc) {
          __s = argv[uVar5 + 1 & 0xffffffff];
        }
        else {
          sVar4 = strlen(pcVar1);
          __s = (char *)malloc(sVar4 + 5);
          snprintf(__s,sVar4 + 5,"%s%s",pcVar1,".bin");
        }
        *out_file_path_ptr = __s;
        return 0;
      }
      if ((pcVar1[1] == 'v') && (pcVar1[2] == '\0')) {
        lVar3 = strtol(argv[uVar5 + 1],(char **)0x0,10);
        *target_driver_ptr = (uint)lVar3;
      }
      else {
        if ((pcVar1[1] != 'o') || (pcVar1[2] != '\0')) {
          fprintf(_stderr,"ERROR: Unrecognized option \"%s\"\n");
          return -1;
        }
        sVar2 = strtol(argv[uVar5 + 1],(char **)0x0,0x10);
        *file_offset_ptr = sVar2;
      }
      uVar5 = uVar5 + 2;
    } while ((int)uVar5 < argc);
  }
  parseArgs_cold_1();
  return -2;
}

Assistant:

int parseArgs(
	int argc, 
	char *argv[], 
	const char ** in_file_path_ptr, 		// memory address for "in_file_path" argument
	const char ** out_file_path_ptr, 		// memory address for "out_file_path" argument
	unsigned int * target_driver_ptr,		// memory address for "target_driver_ptr" argument
	size_t * file_offset_ptr				// memory address for "file_offset_ptr"argument
) {

	int arg_index = 1;		// Tracks index of currently processed argument

	/* Process options (if available) */
	for (; arg_index < argc && argv[arg_index][0] == '-'; arg_index += 2) {
		const char * option_name = argv[arg_index];
		const char * option_raw_value = argv[arg_index+1];

		if (strcmp(option_name, "-v") == 0) {
			*target_driver_ptr = (unsigned int)strtol(option_raw_value, NULL, 10);
		}
		else if (strcmp(option_name, "-o") == 0) {
			*file_offset_ptr = (size_t)strtol(option_raw_value, NULL, 0x10);
		}
		else {
			fprintf(stderr, "ERROR: Unrecognized option \"%s\"\n", option_name);
			return -1;
		}
	}

	/* Process "in_file_path" argument */
	if (arg_index >= argc) {
		fprintf(stderr, "ERROR: Expected \"in_file_path\" after options\n");
		return -2;
	}

	*in_file_path_ptr = argv[arg_index++];

	/* Process "out_file_path" argument */
	if (arg_index >= argc) {
		const char * extension = ".bin";
		const size_t buffer_length = strlen(*in_file_path_ptr) + strlen(extension) + 1;
		char * buffer = malloc(buffer_length);

		snprintf(buffer, buffer_length, "%s%s", *in_file_path_ptr, extension);

		*out_file_path_ptr = (const char*)buffer;
	}
	else {
		*out_file_path_ptr = argv[arg_index++];
	}

	return 0;
}